

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymEnum::gen_code(CTcSymEnum *this,int discard)

{
  int in_ESI;
  CTcSymEnumBase *in_RDI;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  ulong in_stack_ffffffffffffffd8;
  CTcCodeStream *this_00;
  
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    this_00 = G_cs;
    CTcSymEnumBase::get_enum_id(in_RDI);
    CTcDataStream::write_enum_id(&this_00->super_CTcDataStream,in_stack_ffffffffffffffd8);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d7b37);
  }
  return;
}

Assistant:

void CTcSymEnum::gen_code(int discard)
{
    if (!discard)
    {
        /* generate code to push the enum value */
        G_cg->write_op(OPC_PUSHENUM);
        G_cs->write_enum_id(get_enum_id());

        /* note the push */
        G_cg->note_push();
    }
}